

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

BLOCK_SIZE av1_select_sb_size(AV1EncoderConfig *oxcf,int width,int height,int number_spatial_layers)

{
  int iVar1;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int is_4k_or_larger;
  int is_1080p_or_lesser;
  int is_480p_or_lesser;
  int num_tiles;
  TileConfig *tile_cfg;
  int number_spatial_layers_local;
  int height_local;
  int width_local;
  AV1EncoderConfig *oxcf_local;
  BLOCK_SIZE local_1;
  
  if ((oxcf->tool_cfg).superblock_size == AOM_SUPERBLOCK_SIZE_64X64) {
    local_1 = BLOCK_64X64;
  }
  else if ((oxcf->tool_cfg).superblock_size == AOM_SUPERBLOCK_SIZE_128X128) {
    local_1 = BLOCK_128X128;
  }
  else if ((oxcf->mode == '\x02') &&
          (((oxcf->q_cfg).deltaq_mode == '\x03' || ((oxcf->q_cfg).deltaq_mode == '\x04')))) {
    local_1 = BLOCK_64X64;
  }
  else if ((oxcf->q_cfg).deltaq_mode == '\x06') {
    local_1 = BLOCK_64X64;
  }
  else if (number_spatial_layers < 2) {
    if ((oxcf->resize_cfg).resize_mode == '\0') {
      if (oxcf->mode == '\x01') {
        if ((oxcf->tune_cfg).content == AOM_CONTENT_SCREEN) {
          iVar1 = (1 << ((byte)(oxcf->tile_cfg).tile_columns & 0x1f)) *
                  (1 << ((byte)(oxcf->tile_cfg).tile_rows & 0x1f));
          if ((((oxcf->row_mt & 1U) == 1) && (3 < oxcf->max_threads)) &&
             (iVar1 <= oxcf->max_threads)) {
            local_40 = height;
            if (width < height) {
              local_40 = width;
            }
            if ((0x2cf < local_40) && ((width * height) / (iVar1 * 0x4000) < 0x28)) {
              return BLOCK_64X64;
            }
          }
          local_44 = height;
          if (width < height) {
            local_44 = width;
          }
          local_1 = BLOCK_64X64;
          if (0x2cf < local_44) {
            local_1 = BLOCK_128X128;
          }
        }
        else {
          local_48 = height;
          if (width < height) {
            local_48 = width;
          }
          local_1 = BLOCK_64X64;
          if (0x2d0 < local_48) {
            local_1 = BLOCK_128X128;
          }
        }
      }
      else {
        if (((oxcf->superres_cfg).superres_mode == AOM_SUPERRES_NONE) &&
           ((oxcf->resize_cfg).resize_mode == '\0')) {
          local_4c = height;
          if (width < height) {
            local_4c = width;
          }
          if ((0 < oxcf->speed) && (local_4c < 0x1e1)) {
            return BLOCK_64X64;
          }
          local_50 = height;
          if (width < height) {
            local_50 = width;
          }
          if ((((local_4c >= 0x1e1) && (local_50 < 0x439)) && (oxcf->mode == '\0')) &&
             ((((oxcf->row_mt & 1U) == 1 && (1 < oxcf->max_threads)) && (4 < oxcf->speed)))) {
            return BLOCK_64X64;
          }
          local_54 = height;
          if (width < height) {
            local_54 = width;
          }
          if (((oxcf->mode == '\x02') && (8 < oxcf->speed)) && (local_54 < 0x870)) {
            return BLOCK_64X64;
          }
        }
        local_1 = BLOCK_128X128;
      }
    }
    else {
      if ((oxcf->frm_dim_cfg).width < (oxcf->frm_dim_cfg).height) {
        local_3c = (oxcf->frm_dim_cfg).width;
      }
      else {
        local_3c = (oxcf->frm_dim_cfg).height;
      }
      local_1 = BLOCK_64X64;
      if (0x2d0 < local_3c) {
        local_1 = BLOCK_128X128;
      }
    }
  }
  else {
    local_1 = BLOCK_64X64;
  }
  return local_1;
}

Assistant:

BLOCK_SIZE av1_select_sb_size(const AV1EncoderConfig *const oxcf, int width,
                              int height, int number_spatial_layers) {
  if (oxcf->tool_cfg.superblock_size == AOM_SUPERBLOCK_SIZE_64X64) {
    return BLOCK_64X64;
  }
  if (oxcf->tool_cfg.superblock_size == AOM_SUPERBLOCK_SIZE_128X128) {
    return BLOCK_128X128;
  }
#if CONFIG_TFLITE
  if (oxcf->q_cfg.deltaq_mode == DELTA_Q_USER_RATING_BASED) return BLOCK_64X64;
#endif
  // Force 64x64 superblock size to increase resolution in perceptual
  // AQ and user rating based modes.
  if (oxcf->mode == ALLINTRA &&
      (oxcf->q_cfg.deltaq_mode == DELTA_Q_PERCEPTUAL_AI ||
       oxcf->q_cfg.deltaq_mode == DELTA_Q_USER_RATING_BASED)) {
    return BLOCK_64X64;
  }
  // Variance Boost only supports 64x64 superblocks.
  if (oxcf->q_cfg.deltaq_mode == DELTA_Q_VARIANCE_BOOST) {
    return BLOCK_64X64;
  }
  assert(oxcf->tool_cfg.superblock_size == AOM_SUPERBLOCK_SIZE_DYNAMIC);

  if (number_spatial_layers > 1) {
    // For spatial layers better selection may be done given the resolutions
    // used across the layers, but for now use 64x64 for spatial layers.
    return BLOCK_64X64;
  } else if (oxcf->resize_cfg.resize_mode != RESIZE_NONE) {
    // Use the configured size (top resolution) for resize.
    return AOMMIN(oxcf->frm_dim_cfg.width, oxcf->frm_dim_cfg.height) > 720
               ? BLOCK_128X128
               : BLOCK_64X64;
  } else if (oxcf->mode == REALTIME) {
    if (oxcf->tune_cfg.content == AOM_CONTENT_SCREEN) {
      const TileConfig *const tile_cfg = &oxcf->tile_cfg;
      const int num_tiles =
          (1 << tile_cfg->tile_columns) * (1 << tile_cfg->tile_rows);
      // For multi-thread encode: if the number of (128x128) superblocks
      // per tile is low use 64X64 superblock.
      if (oxcf->row_mt == 1 && oxcf->max_threads >= 4 &&
          oxcf->max_threads >= num_tiles && AOMMIN(width, height) >= 720 &&
          (width * height) / (128 * 128 * num_tiles) < 40)
        return BLOCK_64X64;
      else
        return AOMMIN(width, height) >= 720 ? BLOCK_128X128 : BLOCK_64X64;
    } else {
      return AOMMIN(width, height) > 720 ? BLOCK_128X128 : BLOCK_64X64;
    }
  }

  // TODO(any): Possibly could improve this with a heuristic.
  // When superres / resize is on, 'cm->width / height' can change between
  // calls, so we don't apply this heuristic there.
  // Things break if superblock size changes between the first pass and second
  // pass encoding, which is why this heuristic is not configured as a
  // speed-feature.
  if (oxcf->superres_cfg.superres_mode == AOM_SUPERRES_NONE &&
      oxcf->resize_cfg.resize_mode == RESIZE_NONE) {
    int is_480p_or_lesser = AOMMIN(width, height) <= 480;
    if (oxcf->speed >= 1 && is_480p_or_lesser) return BLOCK_64X64;

    // For 1080p and lower resolutions, choose SB size adaptively based on
    // resolution and speed level for multi-thread encode.
    int is_1080p_or_lesser = AOMMIN(width, height) <= 1080;
    if (!is_480p_or_lesser && is_1080p_or_lesser && oxcf->mode == GOOD &&
        oxcf->row_mt == 1 && oxcf->max_threads > 1 && oxcf->speed >= 5)
      return BLOCK_64X64;

    // For allintra encode, since the maximum partition size is set to 32X32 for
    // speed>=6, superblock size is set to 64X64 instead of 128X128. This
    // improves the multithread performance due to reduction in top right delay
    // and thread sync wastage. Currently, this setting is selectively enabled
    // only for speed>=9 and resolutions less than 4k since cost update
    // frequency is set to INTERNAL_COST_UPD_OFF in these cases.
    const int is_4k_or_larger = AOMMIN(width, height) >= 2160;
    if (oxcf->mode == ALLINTRA && oxcf->speed >= 9 && !is_4k_or_larger)
      return BLOCK_64X64;
  }
  return BLOCK_128X128;
}